

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_TextureMapping::Internal_WriteV5(ON_TextureMapping *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  ON_UUID *uuid;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,1);
  if (!bVar1) {
    return false;
  }
  uuid = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
  bVar1 = ON_BinaryArchive::WriteUuid(file,uuid);
  if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_type), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_projection), bVar1)) &&
     ((bVar1 = ON_BinaryArchive::WriteXform(file,&this->m_Pxyz), bVar1 &&
      (bVar1 = ON_BinaryArchive::WriteXform(file,&this->m_uvw), bVar1)))) {
    ON_ModelComponent::Name((ON_ModelComponent *)&stack0xffffffffffffffd8);
    bVar1 = ON_BinaryArchive::WriteString(file,(ON_wString *)&stack0xffffffffffffffd8);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
    if ((bVar1) &&
       ((bVar1 = ON_BinaryArchive::WriteObject
                           (file,(this->m_mapping_primitive).
                                 super___shared_ptr<const_ON_Object,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr), bVar1 &&
        (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_texture_space), bVar1)))) {
      bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bCapped);
      goto LAB_00513ccc;
    }
  }
  bVar1 = false;
LAB_00513ccc:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_TextureMapping::Internal_WriteV5(
  ON_BinaryArchive& file
  ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,1);
  if (rc)
  {

    for(;;)
    {
      rc = file.WriteUuid( Id() );
      if (!rc) break;

      rc = file.WriteInt( static_cast<unsigned int>(m_type) );
      if (!rc) break;

      rc = file.WriteInt( static_cast<unsigned int>(m_projection) );
      if (!rc) break;

      rc = file.WriteXform( m_Pxyz );
      if (!rc) break;

      // Do not write m_Nxyz - it is calculated from m_Pxyz.
      rc = file.WriteXform( m_uvw );
      if (!rc) break;

      rc = file.WriteString(Name());
      if (!rc) break;

      rc = file.WriteObject(m_mapping_primitive.get());
      if (!rc) break;

      // 13 October 2006 ver 1.1 fields
      rc = file.WriteInt( static_cast<unsigned int>(m_texture_space) );
      if (!rc) break;

      rc = file.WriteBool(m_bCapped);
      if (!rc) break;

      break;
    }

    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  return rc;
}